

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# structurally_valid.cc
# Opt level: O2

int google::protobuf::internal::UTF8GenericScanFastAscii
              (UTF8ScanObj *st,char *str,int str_length,int *bytes_consumed)

{
  int iVar1;
  uint *puVar2;
  long lVar3;
  uint *puVar4;
  int iVar5;
  int rest_consumed;
  int local_5c;
  int *local_58;
  long local_50;
  ulong local_48;
  uint *local_40;
  UTF8ScanObj *local_38;
  
  *bytes_consumed = 0;
  if (str_length == 0) {
    iVar1 = 0xf1;
  }
  else {
    local_40 = (uint *)(str + (long)str_length + -7);
    local_48 = (ulong)(uint)-(int)str;
    local_50 = -((long)str << 0x20);
    puVar2 = local_40;
    puVar4 = (uint *)str;
    local_58 = bytes_consumed;
    local_38 = st;
LAB_002595ba:
    do {
      if (puVar4 < str + str_length && ((ulong)puVar4 & 7) != 0) {
        if (-1 < (char)*puVar4) {
          puVar4 = (uint *)((long)puVar4 + 1);
          goto LAB_002595ba;
        }
      }
      else if (((ulong)puVar4 & 7) == 0) {
        for (; (puVar4 < puVar2 && (((puVar4[1] | *puVar4) & 0x80808080) == 0)); puVar4 = puVar4 + 2
            ) {
        }
      }
      iVar5 = (int)local_48 + (int)puVar4;
      lVar3 = ((long)puVar4 << 0x20) + local_50;
      for (; (puVar4 < str + str_length && (-1 < (char)*puVar4));
          puVar4 = (uint *)((long)puVar4 + 1)) {
        iVar5 = iVar5 + 1;
        lVar3 = lVar3 + 0x100000000;
      }
      iVar1 = UTF8GenericScan(local_38,str + (lVar3 >> 0x20),str_length - iVar5,&local_5c);
      puVar4 = (uint *)((long)puVar4 + (long)local_5c);
      puVar2 = local_40;
    } while (iVar1 == 0xfd);
    *local_58 = local_5c + iVar5;
  }
  return iVar1;
}

Assistant:

int UTF8GenericScanFastAscii(const UTF8ScanObj* st,
                    const char * str,
                    int str_length,
                    int* bytes_consumed) {
  *bytes_consumed = 0;
  if (str_length == 0) return kExitOK;

  const uint8* isrc =  reinterpret_cast<const uint8*>(str);
  const uint8* src = isrc;
  const uint8* srclimit = isrc + str_length;
  const uint8* srclimit8 = srclimit - 7;
  int n;
  int rest_consumed;
  int exit_reason;
  do {
    // Check initial few bytes one at a time until 8-byte aligned
    while ((((uintptr_t)src & 0x07) != 0) &&
           (src < srclimit) && (src[0] < 0x80)) {
      src++;
    }
    if (((uintptr_t)src & 0x07) == 0) {
      while ((src < srclimit8) &&
             (((reinterpret_cast<const uint32*>(src)[0] |
                reinterpret_cast<const uint32*>(src)[1]) & 0x80808080) == 0)) {
        src += 8;
      }
    }
    while ((src < srclimit) && (src[0] < 0x80)) {
      src++;
    }
    // Run state table on the rest
    n = src - isrc;
    exit_reason = UTF8GenericScan(st, str + n, str_length - n, &rest_consumed);
    src += rest_consumed;
  } while ( exit_reason == kExitDoAgain );

  *bytes_consumed = src - isrc;
  return exit_reason;
}